

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O0

bool __thiscall
ON_Curve::EvTangent(ON_Curve *this,double t,ON_3dPoint *point,ON_3dVector *tangent,int side,
                   int *hint)

{
  bool bVar1;
  uint uVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  ON_3dVector local_128;
  int local_110;
  int local_10c;
  int test_count;
  int zero_count;
  int negative_count;
  int i;
  double tt;
  double d1od2;
  double d1od2tol;
  double eps;
  ON_3dVector d2;
  ON_3dVector d1;
  ON_3dPoint p;
  double tplus;
  double tminus;
  ON_Interval domain;
  undefined1 auStack_70 [4];
  int rc;
  ON_3dVector D2;
  ON_3dVector D1;
  int *hint_local;
  int side_local;
  ON_3dVector *tangent_local;
  ON_3dPoint *point_local;
  double t_local;
  ON_Curve *this_local;
  
  tangent->x = ON_3dVector::ZeroVector.x;
  tangent->y = ON_3dVector::ZeroVector.y;
  tangent->z = ON_3dVector::ZeroVector.z;
  bVar1 = Ev1Der(this,t,point,tangent,side,hint);
  domain.m_t[1]._4_4_ = (uint)bVar1;
  if (((domain.m_t[1]._4_4_ == 0) || (bVar1 = ON_3dVector::Unitize(tangent), bVar1)) ||
     (bVar1 = Ev2Der(this,t,point,(ON_3dVector *)&D2.z,(ON_3dVector *)auStack_70,side,hint), !bVar1)
     ) goto LAB_00590dfe;
  tangent->x = _auStack_70;
  tangent->y = D2.x;
  tangent->z = D2.y;
  bVar1 = ON_3dVector::Unitize(tangent);
  domain.m_t[1]._4_4_ = (uint)bVar1;
  if (domain.m_t[1]._4_4_ == 0) goto LAB_00590dfe;
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
  tplus = 0.0;
  p.z = 0.0;
  bVar1 = ON_Interval::IsIncreasing((ON_Interval *)&tminus);
  if ((!bVar1) ||
     (uVar2 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2d])(t,this,&tplus,&p.z)
     , (uVar2 & 1) == 0)) goto LAB_00590dfe;
  d1od2tol = 0.0;
  d1od2 = 0.0;
  _negative_count = t;
  pdVar3 = ON_Interval::operator[]((ON_Interval *)&tminus,1);
  if ((*pdVar3 <= t) || (side < 0)) {
    pdVar3 = ON_Interval::operator[]((ON_Interval *)&tminus,0);
    if ((t == *pdVar3) && (!NAN(t) && !NAN(*pdVar3))) goto LAB_00590b3b;
    pdVar3 = ON_Interval::operator[]((ON_Interval *)&tminus,0);
    if ((t < *pdVar3 || t == *pdVar3) || (-1 < side)) {
      pdVar3 = ON_Interval::operator[]((ON_Interval *)&tminus,1);
      if ((t == *pdVar3) && (!NAN(t) && !NAN(*pdVar3))) goto LAB_00590c01;
    }
    else {
LAB_00590c01:
      d1od2tol = tplus - t;
      if ((0.0 <= d1od2tol) ||
         (dVar4 = t + d1od2tol, dVar5 = ON_Interval::ParameterAt((ON_Interval *)&tminus,0.9),
         dVar4 < dVar5)) {
        return domain.m_t[1]._4_4_ != 0;
      }
    }
  }
  else {
LAB_00590b3b:
    d1od2tol = p.z - t;
    if ((d1od2tol <= 0.0) ||
       (dVar4 = t + d1od2tol, dVar5 = ON_Interval::ParameterAt((ON_Interval *)&tminus,0.1),
       dVar5 < dVar4)) {
      return domain.m_t[1]._4_4_ != 0;
    }
  }
  test_count = 0;
  local_10c = 0;
  local_110 = 3;
  for (zero_count = 0; zero_count < local_110; zero_count = zero_count + 1) {
    _negative_count = t + d1od2tol;
    if ((((_negative_count == t) && (!NAN(_negative_count) && !NAN(t))) ||
        (bVar1 = Ev2Der(this,_negative_count,(ON_3dPoint *)&d1.z,(ON_3dVector *)&d2.z,
                        (ON_3dVector *)&eps,side,(int *)0x0), !bVar1)) ||
       (tt = ON_3dVector::operator*((ON_3dVector *)&d2.z,(ON_3dVector *)&eps), d1od2 < tt)) break;
    if (d1od2 <= tt) {
      local_10c = local_10c + 1;
    }
    else {
      test_count = test_count + 1;
    }
    d1od2tol = d1od2tol * 0.5;
  }
  if ((0 < test_count) && (local_110 == test_count + local_10c)) {
    ON_3dVector::operator-(&local_128,tangent);
    tangent->x = local_128.x;
    tangent->y = local_128.y;
    tangent->z = local_128.z;
  }
LAB_00590dfe:
  return domain.m_t[1]._4_4_ != 0;
}

Assistant:

bool ON_Curve::EvTangent(
       double t,
       ON_3dPoint& point,
       ON_3dVector& tangent,
       int side,
       int* hint
       ) const
{
  ON_3dVector D1, D2;//, K;
  tangent = ON_3dVector::ZeroVector;
  int rc = Ev1Der( t, point, tangent, side, hint );
  if ( rc && !tangent.Unitize() ) 
  {
    if ( Ev2Der( t, point, D1, D2, side, hint ) )
    {
      // Use l'Hopital's rule to show that if the unit tangent
      // exists, the 1rst derivative is zero, and the 2nd
      // derivative is nonzero, then the unit tangent is equal
      // to +/-the unitized 2nd derivative.  The sign is equal
      // to the sign of D1(s) o D2(s) as s approaches the 
      // evaluation parameter.
      tangent = D2;
      rc = tangent.Unitize();
      if ( rc )
      {
        ON_Interval domain = Domain();
        double tminus = 0.0;
        double tplus = 0.0;
        if ( domain.IsIncreasing() && GetParameterTolerance( t, &tminus, &tplus ) )
        {
          ON_3dPoint p;
          ON_3dVector d1, d2;
          double eps = 0.0;
          double d1od2tol = 0.0; //1.0e-10; // 1e-5 is too big
          double d1od2;
          double tt = t;
          //double dt = 0.0;

          if ( (t < domain[1] && side >= 0) || (t == domain[0]) )
          {
            eps = tplus-t;
            if ( eps <= 0.0 || t+eps > domain.ParameterAt(0.1) )
              return rc;
          }
          else if ( (t > domain[0] && side < 0) || (t == domain[1]) )
          {
            eps = tminus - t;
            if ( eps >= 0.0 || t+eps < domain.ParameterAt(0.9) )
              return rc;
          }

          int i, negative_count=0, zero_count=0;
          int test_count = 3;
          for ( i = 0; i < test_count; i++, eps *= 0.5 )
          {
            tt = t + eps;
            if ( tt == t )
              break;
            if (!Ev2Der( tt, p, d1, d2, side, 0 ))
              break;
            d1od2 = d1*d2;
            if ( d1od2 > d1od2tol )
              break;
            if ( d1od2 < d1od2tol )
              negative_count++;
            else
              zero_count++;
          }
          if ( negative_count > 0 && test_count == negative_count+zero_count )
          {
            // all sampled d1od2 values were <= 0 
            // and at least one was strictly < 0.
            tangent = -tangent;
          }
        }
      }
    }
  }
  return rc;
}